

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrfac.c
# Opt level: O2

int qrfac_cvkit(integer *m,integer *n,doublereal *a,integer *lda,logical *pivot,integer *ipvt,
               integer *lipvt,doublereal *rdiag,doublereal *acnorm,doublereal *wa)

{
  doublereal *x;
  ulong uVar1;
  integer iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  doublereal *pdVar10;
  doublereal *pdVar11;
  doublereal *pdVar12;
  doublereal dVar13;
  double dVar14;
  double dVar15;
  long local_b8;
  long local_b0;
  long *local_a8;
  doublereal *local_a0;
  doublereal *local_98;
  doublereal *local_90;
  long local_88;
  integer *local_80;
  doublereal *local_78;
  long local_70;
  long local_68;
  doublereal local_60;
  doublereal *local_58;
  doublereal *local_50;
  doublereal local_48;
  
  uVar1 = *lda;
  local_90 = a + ~uVar1;
  local_60 = dpmpar_cvkit(&c__1);
  lVar8 = 0;
  if (0 < *n) {
    lVar8 = *n;
  }
  local_a8 = n;
  local_a0 = a;
  for (lVar9 = 1; lVar9 - lVar8 != 1; lVar9 = lVar9 + 1) {
    dVar13 = enorm_cvkit(m,a);
    acnorm[lVar9 + -1] = dVar13;
    rdiag[lVar9 + -1] = dVar13;
    wa[lVar9 + -1] = dVar13;
    if (*pivot != 0) {
      ipvt[lVar9 + -1] = lVar9;
    }
    a = a + uVar1;
  }
  local_68 = *local_a8;
  if (*m < *local_a8) {
    local_68 = *m;
  }
  if (local_68 < 1) {
    local_68 = 0;
  }
  local_70 = uVar1 * 8 + 8;
  local_98 = local_a0 + uVar1;
  lVar8 = 1;
  local_b8 = 0;
  pdVar10 = local_a0;
  pdVar11 = local_a0;
  local_80 = ipvt;
  for (lVar9 = 0; lVar9 != local_68; lVar9 = lVar9 + 1) {
    if (*pivot != 0) {
      lVar3 = *local_a8;
      if (*local_a8 <= lVar9) {
        lVar3 = lVar9;
      }
      lVar4 = lVar8;
      for (lVar5 = lVar8; lVar5 - lVar3 != 1; lVar5 = lVar5 + 1) {
        lVar6 = lVar5;
        if (rdiag[lVar5 + -1] < rdiag[lVar4 + -1] || rdiag[lVar5 + -1] == rdiag[lVar4 + -1]) {
          lVar6 = lVar4;
        }
        lVar4 = lVar6;
      }
      if (lVar4 != lVar8) {
        lVar3 = *m;
        if (lVar3 < 1) {
          lVar3 = 0;
        }
        lVar5 = (lVar4 * 8 + -8) * uVar1;
        for (lVar6 = 0; lVar3 != lVar6; lVar6 = lVar6 + 1) {
          dVar13 = pdVar10[lVar6];
          pdVar10[lVar6] = *(doublereal *)((long)local_a0 + lVar6 * 8 + lVar5);
          *(doublereal *)((long)local_a0 + lVar6 * 8 + lVar5) = dVar13;
        }
        rdiag[lVar4 + -1] = rdiag[lVar8 + -1];
        wa[lVar4 + -1] = wa[lVar8 + -1];
        iVar2 = local_80[lVar8 + -1];
        local_80[lVar8 + -1] = local_80[lVar4 + -1];
        local_80[lVar4 + -1] = iVar2;
      }
    }
    local_b0 = (*m - lVar8) + 1;
    pdVar12 = local_90 + lVar8;
    x = pdVar12 + lVar8 * uVar1;
    dVar13 = enorm_cvkit(&local_b0,x);
    if ((dVar13 != 0.0) || (NAN(dVar13))) {
      dVar13 = (doublereal)
               (~-(ulong)(*x < 0.0) & (ulong)dVar13 | (ulong)-dVar13 & -(ulong)(*x < 0.0));
      lVar3 = *m;
      if (*m <= lVar9) {
        lVar3 = lVar9;
      }
      for (lVar4 = 0; lVar3 + local_b8 != lVar4; lVar4 = lVar4 + 1) {
        pdVar11[lVar4] = pdVar11[lVar4] / dVar13;
      }
      *x = *x + 1.0;
      lVar3 = *local_a8;
      local_58 = pdVar12;
      if (lVar8 < lVar3) {
        local_78 = local_90 + lVar8 + 1;
        pdVar12 = local_98;
        lVar4 = lVar8;
        local_b0 = lVar3;
        local_50 = x;
        local_48 = dVar13;
        while (lVar5 = lVar4 + 1, lVar5 <= lVar3) {
          local_88 = *m;
          lVar6 = lVar9;
          if (lVar9 < local_88) {
            lVar6 = local_88;
          }
          dVar14 = 0.0;
          for (lVar7 = 0; lVar6 + local_b8 != lVar7; lVar7 = lVar7 + 1) {
            dVar14 = dVar14 + pdVar11[lVar7] * pdVar12[lVar7];
          }
          dVar15 = *local_50;
          lVar6 = lVar9;
          if (lVar9 < local_88) {
            lVar6 = local_88;
          }
          for (lVar7 = 0; lVar6 + local_b8 != lVar7; lVar7 = lVar7 + 1) {
            pdVar12[lVar7] = pdVar11[lVar7] * (-dVar14 / dVar15) + pdVar12[lVar7];
          }
          if (*pivot != 0) {
            dVar14 = rdiag[lVar4];
            if (((dVar14 != 0.0) || (NAN(dVar14))) &&
               (dVar15 = 1.0 - (local_58[lVar5 * uVar1] / dVar14) *
                               (local_58[lVar5 * uVar1] / dVar14),
               dVar14 = SQRT((double)(~-(ulong)(dVar15 <= 0.0) & (ulong)dVar15)) * dVar14,
               rdiag[lVar4] = dVar14, dVar14 = dVar14 / wa[lVar4],
               dVar14 * dVar14 * 0.05 <= local_60)) {
              local_88 = local_88 - lVar8;
              dVar13 = enorm_cvkit(&local_88,local_78 + lVar5 * uVar1);
              rdiag[lVar4] = dVar13;
              wa[lVar4] = dVar13;
              lVar3 = local_b0;
              dVar13 = local_48;
            }
          }
          pdVar12 = pdVar12 + uVar1;
          lVar4 = lVar5;
        }
      }
    }
    rdiag[lVar8 + -1] = -dVar13;
    lVar8 = lVar8 + 1;
    pdVar10 = pdVar10 + uVar1;
    local_b8 = local_b8 + -1;
    pdVar11 = (doublereal *)((long)pdVar11 + local_70);
    local_98 = (doublereal *)((long)local_98 + local_70);
  }
  return 0;
}

Assistant:

int qrfac_cvkit(integer *m, integer *n, doublereal *a, integer *
	lda, logical *pivot, integer *ipvt, integer *lipvt, doublereal *rdiag,
	 doublereal *acnorm, doublereal *wa)
{
    /* Initialized data */

    static doublereal one = 1.;
    static doublereal p05 = .05;
    static doublereal zero = 0.;

    /* System generated locals */
    integer a_dim1, a_offset, i__1, i__2, i__3;
    doublereal d__1, d__2, d__3;

    /* Builtin functions */
    double sqrt(doublereal);

    /* Local variables */
    integer kmax;
    doublereal temp;
    integer i__, j, k, minmn;
    extern doublereal enorm_cvkit(integer *, doublereal *);
    doublereal epsmch;
    extern doublereal dpmpar_cvkit(integer *);
    doublereal ajnorm;
    integer jp1;
    doublereal sum;

/*<       integer m,n,lda,lipvt >*/
/*<       integer ipvt(lipvt) >*/
/*<       logical pivot >*/
/*<       double precision a(lda,n),rdiag(n),acnorm(n),wa(n) >*/
/*     ********** */

/*     subroutine qrfac */

/*     this subroutine uses householder transformations with column */
/*     pivoting (optional) to compute a qr factorization of the */
/*     m by n matrix a. that is, qrfac determines an orthogonal */
/*     matrix q, a permutation matrix p, and an upper trapezoidal */
/*     matrix r with diagonal elements of nonincreasing magnitude, */
/*     such that a*p = q*r. the householder transformation for */
/*     column k, k = 1,2,...,min(m,n), is of the form */

/*                           t */
/*           i - (1/u(k))*u*u */

/*     where u has zeros in the first k-1 positions. the form of */
/*     this transformation and the method of pivoting first */
/*     appeared in the corresponding linpack subroutine. */

/*     the subroutine statement is */

/*       subroutine qrfac(m,n,a,lda,pivot,ipvt,lipvt,rdiag,acnorm,wa) */

/*     where */

/*       m is a positive integer input variable set to the number */
/*         of rows of a. */

/*       n is a positive integer input variable set to the number */
/*         of columns of a. */

/*       a is an m by n array. on input a contains the matrix for */
/*         which the qr factorization is to be computed. on output */
/*         the strict upper trapezoidal part of a contains the strict */
/*         upper trapezoidal part of r, and the lower trapezoidal */
/*         part of a contains a factored form of q (the non-trivial */
/*         elements of the u vectors described above). */

/*       lda is a positive integer input variable not less than m */
/*         which specifies the leading dimension of the array a. */

/*       pivot is a logical input variable. if pivot is set true, */
/*         then column pivoting is enforced. if pivot is set false, */
/*         then no column pivoting is done. */

/*       ipvt is an integer output array of length lipvt. ipvt */
/*         defines the permutation matrix p such that a*p = q*r. */
/*         column j of p is column ipvt(j) of the identity matrix. */
/*         if pivot is false, ipvt is not referenced. */

/*       lipvt is a positive integer input variable. if pivot is false, */
/*         then lipvt may be as small as 1. if pivot is true, then */
/*         lipvt must be at least n. */

/*       rdiag is an output array of length n which contains the */
/*         diagonal elements of r. */

/*       acnorm is an output array of length n which contains the */
/*         norms of the corresponding columns of the input matrix a. */
/*         if this information is not needed, then acnorm can coincide */
/*         with rdiag. */

/*       wa is a work array of length n. if pivot is false, then wa */
/*         can coincide with rdiag. */

/*     subprograms called */

/*       minpack-supplied ... dpmpar,enorm */

/*       fortran-supplied ... dmax1,dsqrt,min0 */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */
/*<       integer i,j,jp1,k,kmax,minmn >*/
/*<       double precision ajnorm,epsmch,one,p05,sum,temp,zero >*/
/*<       double precision dpmpar,enorm >*/
/*<       data one,p05,zero /1.0d0,5.0d-2,0.0d0/ >*/
    /* Parameter adjustments */
    --wa;
    --acnorm;
    --rdiag;
    a_dim1 = *lda;
    a_offset = 1 + a_dim1 * 1;
    a -= a_offset;
    --ipvt;

    /* Function Body */

/*     epsmch is the machine precision. */

/*<       epsmch = dpmpar(1) >*/
    epsmch = dpmpar_cvkit(&c__1);

/*     compute the initial column norms and initialize several arrays. */

/*<       do 10 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<          acnorm(j) = enorm(m,a(1,j)) >*/
	acnorm[j] = enorm_cvkit(m, &a[j * a_dim1 + 1]);
/*<          rdiag(j) = acnorm(j) >*/
	rdiag[j] = acnorm[j];
/*<          wa(j) = rdiag(j) >*/
	wa[j] = rdiag[j];
/*<          if (pivot) ipvt(j) = j >*/
	if (*pivot) {
	    ipvt[j] = j;
	}
/*<    10    continue >*/
/* L10: */
    }

/*     reduce a to r with householder transformations. */

/*<       minmn = min0(m,n) >*/
    minmn = min(*m,*n);
/*<       do 110 j = 1, minmn >*/
    i__1 = minmn;
    for (j = 1; j <= i__1; ++j) {
/*<          if (.not.pivot) go to 40 >*/
	if (! (*pivot)) {
	    goto L40;
	}

/*        bring the column of largest norm into the pivot position. */

/*<          kmax = j >*/
	kmax = j;
/*<          do 20 k = j, n >*/
	i__2 = *n;
	for (k = j; k <= i__2; ++k) {
/*<             if (rdiag(k) .gt. rdiag(kmax)) kmax = k >*/
	    if (rdiag[k] > rdiag[kmax]) {
		kmax = k;
	    }
/*<    20       continue >*/
/* L20: */
	}
/*<          if (kmax .eq. j) go to 40 >*/
	if (kmax == j) {
	    goto L40;
	}
/*<          do 30 i = 1, m >*/
	i__2 = *m;
	for (i__ = 1; i__ <= i__2; ++i__) {
/*<             temp = a(i,j) >*/
	    temp = a[i__ + j * a_dim1];
/*<             a(i,j) = a(i,kmax) >*/
	    a[i__ + j * a_dim1] = a[i__ + kmax * a_dim1];
/*<             a(i,kmax) = temp >*/
	    a[i__ + kmax * a_dim1] = temp;
/*<    30       continue >*/
/* L30: */
	}
/*<          rdiag(kmax) = rdiag(j) >*/
	rdiag[kmax] = rdiag[j];
/*<          wa(kmax) = wa(j) >*/
	wa[kmax] = wa[j];
/*<          k = ipvt(j) >*/
	k = ipvt[j];
/*<          ipvt(j) = ipvt(kmax) >*/
	ipvt[j] = ipvt[kmax];
/*<          ipvt(kmax) = k >*/
	ipvt[kmax] = k;
/*<    40    continue >*/
L40:

/*        compute the householder transformation to reduce the */
/*        j-th column of a to a multiple of the j-th unit vector. */

/*<          ajnorm = enorm(m-j+1,a(j,j)) >*/
	i__2 = *m - j + 1;
	ajnorm = enorm_cvkit(&i__2, &a[j + j * a_dim1]);
/*<          if (ajnorm .eq. zero) go to 100 >*/
	if (ajnorm == zero) {
	    goto L100;
	}
/*<          if (a(j,j) .lt. zero) ajnorm = -ajnorm >*/
	if (a[j + j * a_dim1] < zero) {
	    ajnorm = -ajnorm;
	}
/*<          do 50 i = j, m >*/
	i__2 = *m;
	for (i__ = j; i__ <= i__2; ++i__) {
/*<             a(i,j) = a(i,j)/ajnorm >*/
	    a[i__ + j * a_dim1] /= ajnorm;
/*<    50       continue >*/
/* L50: */
	}
/*<          a(j,j) = a(j,j) + one >*/
	a[j + j * a_dim1] += one;

/*        apply the transformation to the remaining columns */
/*        and update the norms. */

/*<          jp1 = j + 1 >*/
	jp1 = j + 1;
/*<          if (n .lt. jp1) go to 100 >*/
	if (*n < jp1) {
	    goto L100;
	}
/*<          do 90 k = jp1, n >*/
	i__2 = *n;
	for (k = jp1; k <= i__2; ++k) {
/*<             sum = zero >*/
	    sum = zero;
/*<             do 60 i = j, m >*/
	    i__3 = *m;
	    for (i__ = j; i__ <= i__3; ++i__) {
/*<                sum = sum + a(i,j)*a(i,k) >*/
		sum += a[i__ + j * a_dim1] * a[i__ + k * a_dim1];
/*<    60          continue >*/
/* L60: */
	    }
/*<             temp = sum/a(j,j) >*/
	    temp = sum / a[j + j * a_dim1];
/*<             do 70 i = j, m >*/
	    i__3 = *m;
	    for (i__ = j; i__ <= i__3; ++i__) {
/*<                a(i,k) = a(i,k) - temp*a(i,j) >*/
		a[i__ + k * a_dim1] -= temp * a[i__ + j * a_dim1];
/*<    70          continue >*/
/* L70: */
	    }
/*<             if (.not.pivot .or. rdiag(k) .eq. zero) go to 80 >*/
	    if (! (*pivot) || rdiag[k] == zero) {
		goto L80;
	    }
/*<             temp = a(j,k)/rdiag(k) >*/
	    temp = a[j + k * a_dim1] / rdiag[k];
/*<             rdiag(k) = rdiag(k)*dsqrt(dmax1(zero,one-temp**2)) >*/
/* Computing MAX */
/* Computing 2nd power */
	    d__3 = temp;
	    d__1 = zero, d__2 = one - d__3 * d__3;
	    rdiag[k] *= sqrt((max(d__1,d__2)));
/*<             if (p05*(rdiag(k)/wa(k))**2 .gt. epsmch) go to 80 >*/
/* Computing 2nd power */
	    d__1 = rdiag[k] / wa[k];
	    if (p05 * (d__1 * d__1) > epsmch) {
		goto L80;
	    }
/*<             rdiag(k) = enorm(m-j,a(jp1,k)) >*/
	    i__3 = *m - j;
	    rdiag[k] = enorm_cvkit(&i__3, &a[jp1 + k * a_dim1]);
/*<             wa(k) = rdiag(k) >*/
	    wa[k] = rdiag[k];
/*<    80       continue >*/
L80:
/*<    90       continue >*/
/* L90: */
	    ;
	}
/*<   100    continue >*/
L100:
/*<          rdiag(j) = -ajnorm >*/
	rdiag[j] = -ajnorm;
/*<   110    continue >*/
/* L110: */
    }
/*<       return >*/
    return 0;

/*     last card of subroutine qrfac. */

/*<       end >*/
}